

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_catalog.cpp
# Opt level: O1

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::DuckCatalog::CreateSchemaInternal
          (DuckCatalog *this,CatalogTransaction transaction,CreateSchemaInfo *info)

{
  bool bVar1;
  DuckSchemaEntry *this_00;
  pointer this_01;
  LogicalDependencyList dependencies;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_60;
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_58;
  
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  if ((info->super_CreateInfo).internal == false) {
    bVar1 = DefaultSchemaGenerator::IsDefaultSchema(&(info->super_CreateInfo).schema);
    if (bVar1) {
      this_00 = (DuckSchemaEntry *)0x0;
      goto LAB_01226a83;
    }
  }
  this_00 = (DuckSchemaEntry *)operator_new(0x488);
  DuckSchemaEntry::DuckSchemaEntry(this_00,&this->super_Catalog,info);
  this_01 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
            operator->(&this->schemas);
  local_60._M_head_impl = (CatalogEntry *)this_00;
  bVar1 = CatalogSet::CreateEntry
                    (this_01,transaction,&(info->super_CreateInfo).schema,
                     (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                      *)&local_60,(LogicalDependencyList *)&local_58);
  if ((DuckSchemaEntry *)local_60._M_head_impl != (DuckSchemaEntry *)0x0) {
    (*(((SchemaCatalogEntry *)&(local_60._M_head_impl)->_vptr_CatalogEntry)->super_InCatalogEntry).
      super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  local_60._M_head_impl = (CatalogEntry *)0x0;
  if (!bVar1) {
    this_00 = (DuckSchemaEntry *)0x0;
  }
LAB_01226a83:
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_58);
  return (optional_ptr<duckdb::CatalogEntry,_true>)(CatalogEntry *)this_00;
}

Assistant:

optional_ptr<CatalogEntry> DuckCatalog::CreateSchemaInternal(CatalogTransaction transaction, CreateSchemaInfo &info) {
	LogicalDependencyList dependencies;

	if (!info.internal && DefaultSchemaGenerator::IsDefaultSchema(info.schema)) {
		return nullptr;
	}
	auto entry = make_uniq<DuckSchemaEntry>(*this, info);
	auto result = entry.get();
	if (!schemas->CreateEntry(transaction, info.schema, std::move(entry), dependencies)) {
		return nullptr;
	}
	return result;
}